

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

int dlb_fclose(dlb *dp)

{
  int local_14;
  int ret;
  dlb *dp_local;
  
  local_14 = 0;
  if (dlb_initialized != '\0') {
    if (dp->fp == (FILE *)0x0) {
      local_14 = (*dlb_procs->dlb_fclose_proc)(dp);
    }
    else {
      local_14 = fclose((FILE *)dp->fp);
    }
    free(dp);
  }
  return local_14;
}

Assistant:

int dlb_fclose(dlb *dp)
{
	int ret = 0;

    if (dlb_initialized) {
	if (dp->fp) ret = fclose(dp->fp);
	else ret = do_dlb_fclose(dp);

	free(dp);
    }
    return ret;
}